

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe.c
# Opt level: O3

kp_error_t kp_safe_save(kp_ctx *ctx,kp_safe *safe)

{
  kp_agent *agent;
  kp_error_t kVar1;
  ulong uVar2;
  int *piVar3;
  long in_FS_OFFSET;
  undefined8 local_3030;
  undefined1 local_3028 [4096];
  undefined1 local_2028 [4096];
  undefined1 local_1028 [4096];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*ctx->password != '\0') ||
     (kVar1 = kp_password_prompt(ctx,false,ctx->password,"master"), kVar1 == 0)) {
    if ((ctx->agent).connected == true) {
      agent = &ctx->agent;
      memset(local_3028,0,0x3000);
      local_3030 = 0xffffffffffffffff;
      kVar1 = kp_agent_send(agent,KP_MSG_SEARCH,safe->name,0x1000);
      if ((kVar1 == 0) &&
         (kVar1 = kp_agent_receive(agent,KP_MSG_SEARCH,&local_3030,0x3008), kVar1 == 0)) {
        uVar2 = strlcpy(local_2028,safe->password,0x1000);
        if ((uVar2 < 0x1000) && (uVar2 = strlcpy(local_1028,safe->metadata,0x1000), uVar2 < 0x1000))
        {
          kp_agent_send(agent,KP_MSG_STORE,&local_3030,0x3008);
        }
        else {
          piVar3 = __errno_location();
          *piVar3 = 0xc;
        }
      }
    }
    kVar1 = kp_storage_save(ctx,safe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return kVar1;
}

Assistant:

kp_error_t
kp_safe_save(struct kp_ctx *ctx, struct kp_safe *safe)
{
	assert(ctx);
	assert(safe);
	assert(safe->open);

	if (ctx->password[0] == '\0') {
		kp_error_t ret;
		if ((ret = kp_password_prompt(ctx, false,
		                              (char *)ctx->password,
		                              "master")) != KP_SUCCESS) {
			return ret;
		}
	}

	if (ctx->agent.connected) {
		kp_error_t ret;
		struct kp_unsafe unsafe = KP_UNSAFE_INIT;

		if ((ret = kp_agent_send(&ctx->agent, KP_MSG_SEARCH, safe->name,
		    PATH_MAX)) != KP_SUCCESS) {
			/* TODO log reason in verbose mode */
			goto finally;
		}

		if ((ret = kp_agent_receive(&ctx->agent, KP_MSG_SEARCH, &unsafe,
		    sizeof(struct kp_unsafe))) != KP_SUCCESS) {
			if (ret != KP_ERRNO || errno != ENOENT) {
				/* TODO log reason in verbose mode */
			}
			goto finally;
		}

		if (strlcpy(unsafe.password, safe->password,
			    KP_PASSWORD_MAX_LEN) >= KP_PASSWORD_MAX_LEN) {
			errno = ENOMEM;
			goto finally;
		}
		if (strlcpy(unsafe.metadata, safe->metadata,
			    KP_METADATA_MAX_LEN) >= KP_METADATA_MAX_LEN) {
			errno = ENOMEM;
			goto finally;
		}

		if ((ret = kp_agent_send(&ctx->agent, KP_MSG_STORE, &unsafe,
		   sizeof(struct kp_unsafe))) != KP_SUCCESS) {
			/* TODO log reason in verbose mode */
			goto finally;
		}

	}

finally:
	return kp_storage_save(ctx, safe);
}